

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O1

void __thiscall
dynet::PickBatchElements::forward_dev_impl<dynet::Device_CPU>
          (PickBatchElements *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  Tensor *pTVar1;
  pointer ppTVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  int iVar6;
  pointer puVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ostringstream oss;
  type local_1e0;
  type local_1b8;
  type local_1a8 [9];
  
  if (this->pval == (uint *)0x0) {
    if ((long)(this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
              .super__Vector_impl_data._M_start >> 2 != (ulong)(fx->d).bd) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "In PickBatchElements::forward, number of elements in the passed-in index vector ("
                 ,0x51);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,
                 ") did not match number of elements in mini-batch elements in expression (of dimension"
                 ,0x55);
      poVar4 = operator<<(poVar4,&fx->d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(piVar5,(string *)&local_1e0);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pvVar3 = this->pvals;
    puVar7 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar7) {
      uVar8 = 0;
      do {
        ppTVar2 = (xs->
                  super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((*ppTVar2)->d).bd <= puVar7[uVar8]) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"PickBatchElements::forward_impl requested element ",0x32)
          ;
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," from a batch size of ",0x16);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::invalid_argument::invalid_argument(piVar5,(string *)&local_1e0);
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        pTVar1 = *ppTVar2;
        uVar10 = (ulong)(pTVar1->d).nd;
        local_1e0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
        local_1a8[0].m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
        if (uVar10 != 0) {
          uVar9 = 1;
          uVar11 = 0;
          do {
            uVar9 = uVar9 * (pTVar1->d).d[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
          local_1a8[0].m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar9;
        }
        local_1a8[0].m_xpr.m_data = pTVar1->v;
        local_1a8[0].m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(pTVar1->d).bd;
        local_1a8[0].m_offset =
             (Index)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar8];
        uVar10 = (ulong)(fx->d).nd;
        if (uVar10 != 0) {
          uVar9 = 1;
          uVar11 = 0;
          do {
            uVar9 = uVar9 * (fx->d).d[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
          local_1e0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar9;
        }
        local_1e0.m_xpr.m_data = fx->v;
        local_1e0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(fx->d).bd;
        local_1b8.m_data = (StoragePointerType)&local_1e0;
        local_1b8.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)local_1a8;
        local_1e0.m_offset = uVar8;
        Eigen::internal::
        TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
        ::run((TensorAssignOp<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
               *)&local_1b8,dev->edevice);
        uVar8 = (ulong)((int)uVar8 + 1);
        pvVar3 = this->pvals;
        puVar7 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar8 < (ulong)((long)(pvVar3->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 2
                              ));
    }
  }
  else {
    pTVar1 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_1a8[0].m_xpr.m_data = pTVar1->v;
    uVar8 = (ulong)(pTVar1->d).nd;
    if (uVar8 == 0) {
      local_1a8[0].m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
    }
    else {
      uVar9 = 1;
      uVar10 = 0;
      do {
        uVar9 = uVar9 * (pTVar1->d).d[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
      local_1a8[0].m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar9;
    }
    local_1a8[0].m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(pTVar1->d).bd;
    local_1a8[0].m_offset = (Index)*this->pval;
    local_1b8.m_data = fx->v;
    uVar8 = (ulong)(fx->d).nd;
    iVar6 = 1;
    if (uVar8 != 0) {
      uVar10 = 0;
      do {
        iVar6 = iVar6 * (fx->d).d[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
    local_1b8.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = iVar6 * (fx->d).bd;
    local_1b8.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
    local_1e0.m_xpr.m_data = (StoragePointerType)&local_1b8;
    local_1e0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)local_1a8;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
           *)&local_1e0,dev->edevice);
  }
  return;
}

Assistant:

void PickBatchElements::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (pval) {
    fx.tvec().device(*dev.edevice) = xs[0]->tbvec().chip<1>(*pval);
  } else {
    DYNET_ASSERT(pvals != nullptr, "Neither single nor vector of elements available in PickBatchElements::forward");
    DYNET_ARG_CHECK(pvals->size() == fx.d.batch_elems(), 
                            "In PickBatchElements::forward, number of elements in the passed-in index vector (" << pvals->size() << ") "
                            "did not match number of elements in mini-batch elements in expression (of dimension" << fx.d << ")");
    for (unsigned b = 0; b < pvals->size(); ++b) {
      DYNET_ARG_CHECK((*pvals)[b] < xs[0]->d.bd,
                              "PickBatchElements::forward_impl requested element " << (*pvals)[b] << " from a batch size of " << xs[0]->d.bd);
      fx.tbvec().chip<1>(b).device(*dev.edevice) = xs[0]->tbvec().chip<1>((*pvals)[b]);
    }
  }
}